

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfBufferInline.h
# Opt level: O3

void sbfBuffer_destroy(sbfBuffer buffer)

{
  sbfRefCount *psVar1;
  int *piVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  
  LOCK();
  psVar1 = &buffer->mRefCount;
  psVar1->mRefCount = psVar1->mRefCount - 1;
  UNLOCK();
  if (psVar1->mRefCount == 0) {
    if (buffer->mDestroyCb != (sbfBufferDestroyCb)0x0) {
      (*buffer->mDestroyCb)(buffer,buffer->mDestroyData,buffer->mDestroyClosure);
    }
    if (buffer->mAllocated != 0) {
      free(buffer);
      return;
    }
    pvVar3 = buffer[-1].mOwner;
    LOCK();
    piVar2 = (int *)(*(long *)((long)pvVar3 + 0x28) + 0x1c);
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    do {
      pvVar4 = *(void **)((long)pvVar3 + 0x20);
      buffer[-1].mHandlerData = pvVar4;
      LOCK();
      bVar5 = pvVar4 == *(void **)((long)pvVar3 + 0x20);
      if (bVar5) {
        *(void ***)((long)pvVar3 + 0x20) = &buffer[-1].mOwner;
      }
      UNLOCK();
    } while (!bVar5);
  }
  return;
}

Assistant:

static SBF_INLINE void
sbfBuffer_destroy (sbfBuffer buffer)
{
    if (!sbfRefCount_decrement (&buffer->mRefCount))
        return;

    if (buffer->mDestroyCb != NULL)
    {
        buffer->mDestroyCb (buffer,
                            buffer->mDestroyData,
                            buffer->mDestroyClosure);
    }

    if (buffer->mAllocated)
#ifdef WIN32
        LocalFree (buffer);
#else
        free (buffer);
#endif
    else
        sbfPool_put (buffer);
}